

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_set_authorizer
              (sqlite3 *db,_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *xAuth,
              void *pArg)

{
  void *in_RDX;
  sqlite3_xauth in_RSI;
  sqlite3 *in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x144a54);
  in_RDI->xAuth = in_RSI;
  in_RDI->pAuthArg = in_RDX;
  if (in_RDI->xAuth != (sqlite3_xauth)0x0) {
    sqlite3ExpirePreparedStatements(in_RDI,1);
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x144aa1);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_set_authorizer(
  sqlite3 *db,
  int (*xAuth)(void*,int,const char*,const char*,const char*,const char*),
  void *pArg
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->xAuth = (sqlite3_xauth)xAuth;
  db->pAuthArg = pArg;
  if( db->xAuth ) sqlite3ExpirePreparedStatements(db, 1);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}